

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [24];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar112;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar113 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_pow op;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  int local_3aa4;
  int local_3a38;
  undefined8 *local_3a28;
  float *local_3a20;
  undefined1 (*local_3a18) [32];
  float local_3800;
  float fStack_37fc;
  float fStack_37f8;
  float fStack_37f4;
  float fStack_37f0;
  float fStack_37ec;
  float fStack_37e8;
  float local_37e0;
  float fStack_37dc;
  float fStack_37d8;
  float fStack_37d4;
  float fStack_37d0;
  float fStack_37cc;
  float fStack_37c8;
  undefined4 uStack_37c4;
  float local_3780;
  float fStack_377c;
  float fStack_3778;
  float fStack_3774;
  float fStack_3770;
  float fStack_376c;
  float fStack_3768;
  undefined1 local_3720 [8];
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined1 local_3680 [8];
  float fStack_3678;
  float fStack_3674;
  undefined1 local_3660 [8];
  float fStack_3658;
  float fStack_3654;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  float local_3620;
  float fStack_361c;
  float fStack_3618;
  float fStack_3614;
  float local_35c0;
  float fStack_35bc;
  float fStack_35b8;
  float fStack_35b4;
  float fStack_35b0;
  float fStack_35ac;
  float fStack_35a8;
  float local_3560;
  float fStack_355c;
  float fStack_3558;
  float fStack_3554;
  undefined1 local_34a0 [8];
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined1 local_3400 [8];
  float fStack_33f8;
  float fStack_33f4;
  undefined1 local_33e0 [8];
  float fStack_33d8;
  float fStack_33d4;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float local_3340;
  float fStack_333c;
  float fStack_3338;
  float fStack_3334;
  float fStack_3330;
  float fStack_332c;
  float fStack_3328;
  float local_32e0;
  float fStack_32dc;
  float fStack_32d8;
  float fStack_32d4;
  undefined1 local_3240 [8];
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined1 local_31c0 [8];
  float fStack_31b8;
  float fStack_31b4;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined1 local_3140 [8];
  float fStack_3138;
  float fStack_3134;
  float fStack_3130;
  float fStack_312c;
  float fStack_3128;
  float fStack_3124;
  float local_3120;
  float fStack_311c;
  float fStack_3118;
  float fStack_3114;
  float local_30e0;
  float fStack_30dc;
  float fStack_30d8;
  float fStack_30d4;
  float fStack_30d0;
  float fStack_30cc;
  float fStack_30c8;
  float fStack_30c4;
  float local_30c0;
  float fStack_30bc;
  float fStack_30b8;
  float fStack_30b4;
  float fStack_30b0;
  float fStack_30ac;
  float fStack_30a8;
  float fStack_30a4;
  float local_3080;
  float fStack_307c;
  float fStack_3078;
  float fStack_3074;
  float fStack_3070;
  float fStack_306c;
  float fStack_3068;
  float fStack_3064;
  float local_2f80;
  float fStack_2f7c;
  float fStack_2f78;
  float fStack_2f74;
  undefined1 local_2ee0 [8];
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined1 local_2e60 [8];
  float fStack_2e58;
  float fStack_2e54;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined1 local_2de0 [8];
  float fStack_2dd8;
  float fStack_2dd4;
  float fStack_2dd0;
  float fStack_2dcc;
  float fStack_2dc8;
  float fStack_2dc4;
  float local_2dc0;
  float fStack_2dbc;
  float fStack_2db8;
  float fStack_2db4;
  float local_2d80;
  float fStack_2d7c;
  float fStack_2d78;
  float fStack_2d74;
  float fStack_2d70;
  float fStack_2d6c;
  float fStack_2d68;
  float fStack_2d64;
  float local_2d60;
  float fStack_2d5c;
  float fStack_2d58;
  float fStack_2d54;
  float fStack_2d50;
  float fStack_2d4c;
  float fStack_2d48;
  float fStack_2d44;
  float local_2d20;
  float fStack_2d1c;
  float fStack_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  float fStack_2d04;
  float local_2c20;
  float fStack_2c1c;
  float fStack_2c18;
  float fStack_2c14;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  undefined1 local_ad0 [8];
  undefined8 uStack_ac8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined8 local_a70;
  undefined8 uStack_a68;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_920 [8];
  undefined8 uStack_918;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  
  local_3a28 = in_RDX;
  local_3a20 = in_RSI;
  local_3a18 = in_RDI;
  if (in_R8D == 8) {
    for (local_3a38 = 0; local_3a38 < in_ECX; local_3a38 = local_3a38 + 1) {
      fVar112 = *local_3a20;
      auVar2 = vinsertps_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar112),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar112),0x30);
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar112),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar112),0x30);
      auVar1 = vcmpps_avx(*local_3a18,ZEXT1632(ZEXT816(0)),2);
      auVar5._8_8_ = 0x80000000800000;
      auVar5._0_8_ = 0x80000000800000;
      auVar5._16_8_ = 0x80000000800000;
      auVar5._24_8_ = 0x80000000800000;
      auVar4 = vmaxps_avx(*local_3a18,auVar5);
      auVar6 = vpsrld_avx(auVar4._0_16_,ZEXT416(0x17));
      auVar7 = vpsrld_avx(auVar4._16_16_,ZEXT416(0x17));
      auVar17._8_8_ = 0x807fffff807fffff;
      auVar17._0_8_ = 0x807fffff807fffff;
      auVar17._16_8_ = 0x807fffff807fffff;
      auVar17._24_8_ = 0x807fffff807fffff;
      auVar4 = vandps_avx(auVar4,auVar17);
      auVar66._8_8_ = 0x3f0000003f000000;
      auVar66._0_8_ = 0x3f0000003f000000;
      auVar66._16_8_ = 0x3f0000003f000000;
      auVar66._24_8_ = 0x3f0000003f000000;
      auVar5 = vorps_avx(auVar4,auVar66);
      auVar73._8_8_ = 0x7f0000007f;
      auVar73._0_8_ = 0x7f0000007f;
      auVar6 = vpsubd_avx(auVar6,auVar73);
      auVar72._8_8_ = 0x7f0000007f;
      auVar72._0_8_ = 0x7f0000007f;
      auVar7 = vpsubd_avx(auVar7,auVar72);
      local_dc0 = auVar7._0_8_;
      uStack_db8 = auVar7._8_8_;
      auVar68._16_8_ = local_dc0;
      auVar68._0_16_ = auVar6;
      auVar68._24_8_ = uStack_db8;
      auVar4 = vcvtdq2ps_avx(auVar68);
      local_2d20 = auVar4._0_4_;
      fStack_2d1c = auVar4._4_4_;
      fStack_2d18 = auVar4._8_4_;
      fStack_2d14 = auVar4._12_4_;
      fStack_2d10 = auVar4._16_4_;
      fStack_2d0c = auVar4._20_4_;
      fStack_2d08 = auVar4._24_4_;
      fStack_2d04 = auVar4._28_4_;
      local_2e60._4_4_ = fStack_2d1c + 1.0;
      local_2e60._0_4_ = local_2d20 + 1.0;
      fStack_2e58 = fStack_2d18 + 1.0;
      fStack_2e54 = fStack_2d14 + 1.0;
      uStack_2e50._0_4_ = fStack_2d10 + 1.0;
      uStack_2e50._4_4_ = fStack_2d0c + 1.0;
      uStack_2e48._0_4_ = fStack_2d08 + 1.0;
      uStack_2e48._4_4_ = fStack_2d04 + 1.0;
      auVar14 = _local_2e60;
      auVar113 = vcmpps_avx(auVar5,_DAT_01f9fbe0,1);
      auVar4 = vandps_avx(auVar5,auVar113);
      auVar15._8_8_ = 0x3f8000003f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._16_8_ = 0x3f8000003f800000;
      auVar15._24_8_ = 0x3f8000003f800000;
      auVar5 = vsubps_avx(auVar5,auVar15);
      uStack_2e48 = auVar14._24_8_;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._16_8_ = 0x3f8000003f800000;
      auVar16._24_8_ = 0x3f8000003f800000;
      auVar113 = vandps_avx(auVar16,auVar113);
      auVar14._16_8_ = uStack_2e50;
      auVar14._0_16_ = _local_2e60;
      auVar14._24_8_ = uStack_2e48;
      auVar113 = vsubps_avx(auVar14,auVar113);
      local_2d60 = auVar5._0_4_;
      fStack_2d5c = auVar5._4_4_;
      fStack_2d58 = auVar5._8_4_;
      fStack_2d54 = auVar5._12_4_;
      fStack_2d50 = auVar5._16_4_;
      fStack_2d4c = auVar5._20_4_;
      fStack_2d48 = auVar5._24_4_;
      fStack_2d44 = auVar5._28_4_;
      local_2d80 = auVar4._0_4_;
      fStack_2d7c = auVar4._4_4_;
      fStack_2d78 = auVar4._8_4_;
      fStack_2d74 = auVar4._12_4_;
      fStack_2d70 = auVar4._16_4_;
      fStack_2d6c = auVar4._20_4_;
      fStack_2d68 = auVar4._24_4_;
      fStack_2d64 = auVar4._28_4_;
      local_2de0._0_4_ = local_2d60 + local_2d80;
      local_2de0._4_4_ = fStack_2d5c + fStack_2d7c;
      fStack_2dd8 = fStack_2d58 + fStack_2d78;
      fStack_2dd4 = fStack_2d54 + fStack_2d74;
      fStack_2dd0 = fStack_2d50 + fStack_2d70;
      fStack_2dcc = fStack_2d4c + fStack_2d6c;
      fStack_2dc8 = fStack_2d48 + fStack_2d68;
      fStack_2dc4 = fStack_2d44 + fStack_2d64;
      uStack_2ed8 = 0x3d9021bb3d9021bb;
      local_2ee0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_2ed0 = 0x3d9021bb3d9021bb;
      uStack_2ec8 = 0x3d9021bb3d9021bb;
      auVar46._8_4_ = -0.1151461;
      auVar46._12_4_ = -0.1151461;
      auVar46._0_4_ = -0.1151461;
      auVar46._4_4_ = -0.1151461;
      auVar46._16_4_ = -0.1151461;
      auVar46._20_4_ = -0.1151461;
      auVar46._24_4_ = -0.1151461;
      auVar46._28_4_ = -0.1151461;
      auVar6 = vfmadd213ps_fma(_local_2de0,_local_2ee0,auVar46);
      auVar47._8_4_ = 0.116769984;
      auVar47._12_4_ = 0.116769984;
      auVar47._0_4_ = 0.116769984;
      auVar47._4_4_ = 0.116769984;
      auVar47._16_4_ = 0.116769984;
      auVar47._20_4_ = 0.116769984;
      auVar47._24_4_ = 0.116769984;
      auVar47._28_4_ = 0.116769984;
      auVar6 = vfmadd213ps_fma(_local_2de0,ZEXT1632(auVar6),auVar47);
      auVar48._8_4_ = -0.12420141;
      auVar48._12_4_ = -0.12420141;
      auVar48._0_4_ = -0.12420141;
      auVar48._4_4_ = -0.12420141;
      auVar48._16_4_ = -0.12420141;
      auVar48._20_4_ = -0.12420141;
      auVar48._24_4_ = -0.12420141;
      auVar48._28_4_ = -0.12420141;
      auVar6 = vfmadd213ps_fma(_local_2de0,ZEXT1632(auVar6),auVar48);
      auVar49._8_4_ = 0.14249323;
      auVar49._12_4_ = 0.14249323;
      auVar49._0_4_ = 0.14249323;
      auVar49._4_4_ = 0.14249323;
      auVar49._16_4_ = 0.14249323;
      auVar49._20_4_ = 0.14249323;
      auVar49._24_4_ = 0.14249323;
      auVar49._28_4_ = 0.14249323;
      auVar6 = vfmadd213ps_fma(_local_2de0,ZEXT1632(auVar6),auVar49);
      auVar50._8_4_ = -0.16668057;
      auVar50._12_4_ = -0.16668057;
      auVar50._0_4_ = -0.16668057;
      auVar50._4_4_ = -0.16668057;
      auVar50._16_4_ = -0.16668057;
      auVar50._20_4_ = -0.16668057;
      auVar50._24_4_ = -0.16668057;
      auVar50._28_4_ = -0.16668057;
      auVar6 = vfmadd213ps_fma(_local_2de0,ZEXT1632(auVar6),auVar50);
      auVar51._8_4_ = 0.20000714;
      auVar51._12_4_ = 0.20000714;
      auVar51._0_4_ = 0.20000714;
      auVar51._4_4_ = 0.20000714;
      auVar51._16_4_ = 0.20000714;
      auVar51._20_4_ = 0.20000714;
      auVar51._24_4_ = 0.20000714;
      auVar51._28_4_ = 0.20000714;
      auVar6 = vfmadd213ps_fma(_local_2de0,ZEXT1632(auVar6),auVar51);
      auVar52._8_4_ = -0.24999994;
      auVar52._12_4_ = -0.24999994;
      auVar52._0_4_ = -0.24999994;
      auVar52._4_4_ = -0.24999994;
      auVar52._16_4_ = -0.24999994;
      auVar52._20_4_ = -0.24999994;
      auVar52._24_4_ = -0.24999994;
      auVar52._28_4_ = -0.24999994;
      auVar6 = vfmadd213ps_fma(_local_2de0,ZEXT1632(auVar6),auVar52);
      auVar53._8_4_ = 0.3333333;
      auVar53._12_4_ = 0.3333333;
      auVar53._0_4_ = 0.3333333;
      auVar53._4_4_ = 0.3333333;
      auVar53._16_4_ = 0.3333333;
      auVar53._20_4_ = 0.3333333;
      auVar53._24_4_ = 0.3333333;
      auVar53._28_4_ = 0.3333333;
      auVar6 = vfmadd213ps_fma(_local_2de0,ZEXT1632(auVar6),auVar53);
      local_2c20 = auVar6._0_4_;
      fStack_2c1c = auVar6._4_4_;
      fStack_2c18 = auVar6._8_4_;
      fStack_2c14 = auVar6._12_4_;
      local_2ee0._4_4_ =
           fStack_2c1c * (float)local_2de0._4_4_ * (float)local_2de0._4_4_ * (float)local_2de0._4_4_
      ;
      local_2ee0._0_4_ =
           local_2c20 * (float)local_2de0._0_4_ * (float)local_2de0._0_4_ * (float)local_2de0._0_4_;
      uStack_2ed8._0_4_ = fStack_2c18 * fStack_2dd8 * fStack_2dd8 * fStack_2dd8;
      uStack_2ed8._4_4_ = fStack_2c14 * fStack_2dd4 * fStack_2dd4 * fStack_2dd4;
      uStack_2ed0._0_4_ = fStack_2dd0 * 0.0 * fStack_2dd0 * fStack_2dd0;
      uStack_2ed0._4_4_ = fStack_2dcc * 0.0 * fStack_2dcc * fStack_2dcc;
      uStack_2ec8._0_4_ = fStack_2dc8 * 0.0 * fStack_2dc8 * fStack_2dc8;
      uStack_2ec8._4_4_ = 0;
      auVar54._8_4_ = -0.00021219444;
      auVar54._12_4_ = -0.00021219444;
      auVar54._0_4_ = -0.00021219444;
      auVar54._4_4_ = -0.00021219444;
      auVar54._16_4_ = -0.00021219444;
      auVar54._20_4_ = -0.00021219444;
      auVar54._24_4_ = -0.00021219444;
      auVar54._28_4_ = -0.00021219444;
      auVar6 = vfmadd213ps_fma(auVar54,auVar113,_local_2ee0);
      auVar109._4_4_ = (float)local_2de0._4_4_ * (float)local_2de0._4_4_;
      auVar109._0_4_ = (float)local_2de0._0_4_ * (float)local_2de0._0_4_;
      auVar109._8_4_ = fStack_2dd8 * fStack_2dd8;
      auVar109._12_4_ = fStack_2dd4 * fStack_2dd4;
      auVar109._16_4_ = fStack_2dd0 * fStack_2dd0;
      auVar109._20_4_ = fStack_2dcc * fStack_2dcc;
      auVar109._24_4_ = fStack_2dc8 * fStack_2dc8;
      auVar109._28_4_ = fStack_2dc4;
      auVar61._8_4_ = 0.5;
      auVar61._12_4_ = 0.5;
      auVar61._0_4_ = 0.5;
      auVar61._4_4_ = 0.5;
      auVar61._16_4_ = 0.5;
      auVar61._20_4_ = 0.5;
      auVar61._24_4_ = 0.5;
      auVar61._28_4_ = 0.5;
      auVar6 = vfnmadd213ps_fma(auVar61,auVar109,ZEXT1632(auVar6));
      local_2dc0 = auVar6._0_4_;
      fStack_2dbc = auVar6._4_4_;
      fStack_2db8 = auVar6._8_4_;
      fStack_2db4 = auVar6._12_4_;
      local_2de0._4_4_ = (float)local_2de0._4_4_ + fStack_2dbc;
      local_2de0._0_4_ = (float)local_2de0._0_4_ + local_2dc0;
      fStack_2dd8 = fStack_2dd8 + fStack_2db8;
      fStack_2dd4 = fStack_2dd4 + fStack_2db4;
      fStack_2dd0 = fStack_2dd0 + 0.0;
      fStack_2dcc = fStack_2dcc + 0.0;
      fStack_2dc8 = fStack_2dc8 + 0.0;
      fStack_2dc4 = fStack_2dc4 + 0.0;
      auVar55._8_4_ = 0.6933594;
      auVar55._12_4_ = 0.6933594;
      auVar55._0_4_ = 0.6933594;
      auVar55._4_4_ = 0.6933594;
      auVar55._16_4_ = 0.6933594;
      auVar55._20_4_ = 0.6933594;
      auVar55._24_4_ = 0.6933594;
      auVar55._28_4_ = 0.6933594;
      auVar6 = vfmadd213ps_fma(auVar55,auVar113,_local_2de0);
      auVar4 = vorps_avx(ZEXT1632(auVar6),auVar1);
      local_37e0 = auVar2._0_4_;
      fStack_37dc = auVar2._4_4_;
      fStack_37d8 = auVar2._8_4_;
      fStack_37d4 = auVar2._12_4_;
      fStack_37d0 = auVar3._0_4_;
      fStack_37cc = auVar3._4_4_;
      fStack_37c8 = auVar3._8_4_;
      uStack_37c4 = auVar3._12_4_;
      local_3800 = auVar4._0_4_;
      fStack_37fc = auVar4._4_4_;
      fStack_37f8 = auVar4._8_4_;
      fStack_37f4 = auVar4._12_4_;
      fStack_37f0 = auVar4._16_4_;
      fStack_37ec = auVar4._20_4_;
      fStack_37e8 = auVar4._24_4_;
      local_33e0._4_4_ = fStack_37dc * fStack_37fc;
      local_33e0._0_4_ = local_37e0 * local_3800;
      fStack_33d8 = fStack_37d8 * fStack_37f8;
      fStack_33d4 = fStack_37d4 * fStack_37f4;
      uStack_33d0._0_4_ = fStack_37d0 * fStack_37f0;
      uStack_33d0._4_4_ = fStack_37cc * fStack_37ec;
      uStack_33c8._0_4_ = fStack_37c8 * fStack_37e8;
      uStack_33c8._4_4_ = uStack_37c4;
      auVar4 = _local_33e0;
      uStack_33c8 = auVar4._24_8_;
      auVar1._16_8_ = uStack_33d0;
      auVar1._0_16_ = _local_33e0;
      auVar1._24_8_ = uStack_33c8;
      auVar4._8_8_ = 0x42b0c0a542b0c0a5;
      auVar4._0_8_ = 0x42b0c0a542b0c0a5;
      auVar4._16_8_ = 0x42b0c0a542b0c0a5;
      auVar4._24_8_ = 0x42b0c0a542b0c0a5;
      auVar4 = vminps_avx(auVar1,auVar4);
      auVar113._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar113._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar113._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar113._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar113 = vmaxps_avx(auVar4,auVar113);
      auVar30._8_4_ = 1.442695;
      auVar30._12_4_ = 1.442695;
      auVar30._0_4_ = 1.442695;
      auVar30._4_4_ = 1.442695;
      auVar30._16_4_ = 1.442695;
      auVar30._20_4_ = 1.442695;
      auVar30._24_4_ = 1.442695;
      auVar30._28_4_ = 1.442695;
      auVar29._8_4_ = 0.5;
      auVar29._12_4_ = 0.5;
      auVar29._0_4_ = 0.5;
      auVar29._4_4_ = 0.5;
      auVar29._16_4_ = 0.5;
      auVar29._20_4_ = 0.5;
      auVar29._24_4_ = 0.5;
      auVar29._28_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(auVar30,auVar113,auVar29);
      auVar1 = vroundps_avx(ZEXT1632(auVar2),1);
      auVar4 = vcmpps_avx(ZEXT1632(auVar2),auVar1,1);
      auVar20._8_8_ = 0x3f8000003f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._16_8_ = 0x3f8000003f800000;
      auVar20._24_8_ = 0x3f8000003f800000;
      auVar4 = vandps_avx(auVar4,auVar20);
      auVar4 = vsubps_avx(auVar1,auVar4);
      auVar58._8_4_ = 0.6933594;
      auVar58._12_4_ = 0.6933594;
      auVar58._0_4_ = 0.6933594;
      auVar58._4_4_ = 0.6933594;
      auVar58._16_4_ = 0.6933594;
      auVar58._20_4_ = 0.6933594;
      auVar58._24_4_ = 0.6933594;
      auVar58._28_4_ = 0.6933594;
      auVar2 = vfnmadd213ps_fma(auVar58,auVar4,auVar113);
      auVar59._8_4_ = -0.00021219444;
      auVar59._12_4_ = -0.00021219444;
      auVar59._0_4_ = -0.00021219444;
      auVar59._4_4_ = -0.00021219444;
      auVar59._16_4_ = -0.00021219444;
      auVar59._20_4_ = -0.00021219444;
      auVar59._24_4_ = -0.00021219444;
      auVar59._28_4_ = -0.00021219444;
      auVar2 = vfnmadd213ps_fma(auVar59,auVar4,ZEXT1632(auVar2));
      auVar113 = ZEXT1632(auVar2);
      local_32e0 = auVar2._0_4_;
      fStack_32dc = auVar2._4_4_;
      fStack_32d8 = auVar2._8_4_;
      fStack_32d4 = auVar2._12_4_;
      _local_3400 = ZEXT1632(CONCAT412(fStack_32d4 * fStack_32d4,
                                       CONCAT48(fStack_32d8 * fStack_32d8,
                                                CONCAT44(fStack_32dc * fStack_32dc,
                                                         local_32e0 * local_32e0))));
      uStack_3498 = 0x3950696739506967;
      local_34a0 = (undefined1  [8])0x3950696739506967;
      uStack_3490 = 0x3950696739506967;
      uStack_3488 = 0x3950696739506967;
      auVar31._8_4_ = 0.0013981999;
      auVar31._12_4_ = 0.0013981999;
      auVar31._0_4_ = 0.0013981999;
      auVar31._4_4_ = 0.0013981999;
      auVar31._16_4_ = 0.0013981999;
      auVar31._20_4_ = 0.0013981999;
      auVar31._24_4_ = 0.0013981999;
      auVar31._28_4_ = 0.0013981999;
      auVar2 = vfmadd213ps_fma(auVar113,_local_34a0,auVar31);
      auVar32._8_4_ = 0.008333452;
      auVar32._12_4_ = 0.008333452;
      auVar32._0_4_ = 0.008333452;
      auVar32._4_4_ = 0.008333452;
      auVar32._16_4_ = 0.008333452;
      auVar32._20_4_ = 0.008333452;
      auVar32._24_4_ = 0.008333452;
      auVar32._28_4_ = 0.008333452;
      auVar2 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar2),auVar32);
      auVar33._8_4_ = 0.041665796;
      auVar33._12_4_ = 0.041665796;
      auVar33._0_4_ = 0.041665796;
      auVar33._4_4_ = 0.041665796;
      auVar33._16_4_ = 0.041665796;
      auVar33._20_4_ = 0.041665796;
      auVar33._24_4_ = 0.041665796;
      auVar33._28_4_ = 0.041665796;
      auVar2 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar2),auVar33);
      auVar34._8_4_ = 0.16666666;
      auVar34._12_4_ = 0.16666666;
      auVar34._0_4_ = 0.16666666;
      auVar34._4_4_ = 0.16666666;
      auVar34._16_4_ = 0.16666666;
      auVar34._20_4_ = 0.16666666;
      auVar34._24_4_ = 0.16666666;
      auVar34._28_4_ = 0.16666666;
      auVar2 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar2),auVar34);
      auVar35._8_4_ = 0.5;
      auVar35._12_4_ = 0.5;
      auVar35._0_4_ = 0.5;
      auVar35._4_4_ = 0.5;
      auVar35._16_4_ = 0.5;
      auVar35._20_4_ = 0.5;
      auVar35._24_4_ = 0.5;
      auVar35._28_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar2),auVar35);
      auVar2 = vfmadd213ps_fma(_local_3400,ZEXT1632(auVar2),auVar113);
      local_33a0 = auVar2._0_4_;
      fStack_339c = auVar2._4_4_;
      fStack_3398 = auVar2._8_4_;
      fStack_3394 = auVar2._12_4_;
      local_2520 = auVar4._0_4_;
      fStack_251c = auVar4._4_4_;
      fStack_2518 = auVar4._8_4_;
      fStack_2514 = auVar4._12_4_;
      fStack_2510 = auVar4._16_4_;
      fStack_250c = auVar4._20_4_;
      fStack_2508 = auVar4._24_4_;
      fStack_2504 = auVar4._28_4_;
      local_3440 = CONCAT44((int)fStack_251c,(int)local_2520);
      uStack_3438 = CONCAT44((int)fStack_2514,(int)fStack_2518);
      uStack_3430 = CONCAT44((int)fStack_250c,(int)fStack_2510);
      uStack_3428 = CONCAT44((int)fStack_2504,(int)fStack_2508);
      auVar7._8_8_ = uStack_3438;
      auVar7._0_8_ = local_3440;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar7,auVar2);
      auVar6._8_8_ = uStack_3428;
      auVar6._0_8_ = uStack_3430;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      auVar3 = vpaddd_avx(auVar6,auVar3);
      auVar2 = vpslld_avx(auVar2,ZEXT416(0x17));
      auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
      local_3340 = auVar2._0_4_;
      fStack_333c = auVar2._4_4_;
      fStack_3338 = auVar2._8_4_;
      fStack_3334 = auVar2._12_4_;
      fStack_3330 = auVar3._0_4_;
      fStack_332c = auVar3._4_4_;
      fStack_3328 = auVar3._8_4_;
      local_34a0._4_4_ = (fStack_339c + 1.0) * fStack_333c;
      local_34a0._0_4_ = (local_33a0 + 1.0) * local_3340;
      uStack_3498._0_4_ = (fStack_3398 + 1.0) * fStack_3338;
      uStack_3498._4_4_ = (fStack_3394 + 1.0) * fStack_3334;
      uStack_3490._0_4_ = fStack_3330 * 1.0;
      uStack_3490._4_4_ = fStack_332c * 1.0;
      auVar111 = _local_34a0;
      uStack_3488._0_4_ = fStack_3328 * 1.0;
      uStack_3488._4_4_ = 0x3f800000;
      auVar4 = _local_34a0;
      uStack_3490 = auVar111._16_8_;
      uStack_3488 = auVar4._24_8_;
      *local_3a28 = local_34a0;
      local_3a28[1] = uStack_3498;
      local_3a28[2] = uStack_3490;
      local_3a28[3] = uStack_3488;
      local_3a18 = local_3a18 + 1;
      local_3a20 = local_3a20 + 1;
      local_3a28 = local_3a28 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_3aa4 = 0; local_3aa4 + 1 < in_ECX; local_3aa4 = local_3aa4 + 2) {
      fVar112 = *local_3a20;
      uStack_3648._4_4_ = local_3a20[1];
      auVar1 = vcmpps_avx(*local_3a18,ZEXT1632(ZEXT816(0)),2);
      auVar13._8_8_ = 0x80000000800000;
      auVar13._0_8_ = 0x80000000800000;
      auVar13._16_8_ = 0x80000000800000;
      auVar13._24_8_ = 0x80000000800000;
      auVar4 = vmaxps_avx(*local_3a18,auVar13);
      auVar2 = vpsrld_avx(auVar4._0_16_,ZEXT416(0x17));
      auVar3 = vpsrld_avx(auVar4._16_16_,ZEXT416(0x17));
      auVar19._8_8_ = 0x807fffff807fffff;
      auVar19._0_8_ = 0x807fffff807fffff;
      auVar19._16_8_ = 0x807fffff807fffff;
      auVar19._24_8_ = 0x807fffff807fffff;
      auVar4 = vandps_avx(auVar4,auVar19);
      auVar67._8_8_ = 0x3f0000003f000000;
      auVar67._0_8_ = 0x3f0000003f000000;
      auVar67._16_8_ = 0x3f0000003f000000;
      auVar67._24_8_ = 0x3f0000003f000000;
      auVar5 = vorps_avx(auVar4,auVar67);
      auVar71._8_8_ = 0x7f0000007f;
      auVar71._0_8_ = 0x7f0000007f;
      auVar2 = vpsubd_avx(auVar2,auVar71);
      auVar70._8_8_ = 0x7f0000007f;
      auVar70._0_8_ = 0x7f0000007f;
      auVar3 = vpsubd_avx(auVar3,auVar70);
      local_cc0 = auVar3._0_8_;
      uStack_cb8 = auVar3._8_8_;
      auVar69._16_8_ = local_cc0;
      auVar69._0_16_ = auVar2;
      auVar69._24_8_ = uStack_cb8;
      auVar4 = vcvtdq2ps_avx(auVar69);
      local_3080 = auVar4._0_4_;
      fStack_307c = auVar4._4_4_;
      fStack_3078 = auVar4._8_4_;
      fStack_3074 = auVar4._12_4_;
      fStack_3070 = auVar4._16_4_;
      fStack_306c = auVar4._20_4_;
      fStack_3068 = auVar4._24_4_;
      fStack_3064 = auVar4._28_4_;
      local_31c0._4_4_ = fStack_307c + 1.0;
      local_31c0._0_4_ = local_3080 + 1.0;
      fStack_31b8 = fStack_3078 + 1.0;
      fStack_31b4 = fStack_3074 + 1.0;
      uStack_31b0._0_4_ = fStack_3070 + 1.0;
      uStack_31b0._4_4_ = fStack_306c + 1.0;
      uStack_31a8._0_4_ = fStack_3068 + 1.0;
      uStack_31a8._4_4_ = fStack_3064 + 1.0;
      auVar14 = _local_31c0;
      auVar113 = vcmpps_avx(auVar5,_DAT_01f9fbe0,1);
      auVar4 = vandps_avx(auVar5,auVar113);
      auVar12._8_8_ = 0x3f8000003f800000;
      auVar12._0_8_ = 0x3f8000003f800000;
      auVar12._16_8_ = 0x3f8000003f800000;
      auVar12._24_8_ = 0x3f8000003f800000;
      auVar5 = vsubps_avx(auVar5,auVar12);
      uStack_31a8 = auVar14._24_8_;
      auVar18._8_8_ = 0x3f8000003f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._16_8_ = 0x3f8000003f800000;
      auVar18._24_8_ = 0x3f8000003f800000;
      auVar113 = vandps_avx(auVar18,auVar113);
      auVar11._16_8_ = uStack_31b0;
      auVar11._0_16_ = _local_31c0;
      auVar11._24_8_ = uStack_31a8;
      auVar113 = vsubps_avx(auVar11,auVar113);
      local_30c0 = auVar5._0_4_;
      fStack_30bc = auVar5._4_4_;
      fStack_30b8 = auVar5._8_4_;
      fStack_30b4 = auVar5._12_4_;
      fStack_30b0 = auVar5._16_4_;
      fStack_30ac = auVar5._20_4_;
      fStack_30a8 = auVar5._24_4_;
      fStack_30a4 = auVar5._28_4_;
      local_30e0 = auVar4._0_4_;
      fStack_30dc = auVar4._4_4_;
      fStack_30d8 = auVar4._8_4_;
      fStack_30d4 = auVar4._12_4_;
      fStack_30d0 = auVar4._16_4_;
      fStack_30cc = auVar4._20_4_;
      fStack_30c8 = auVar4._24_4_;
      fStack_30c4 = auVar4._28_4_;
      local_3140._0_4_ = local_30c0 + local_30e0;
      local_3140._4_4_ = fStack_30bc + fStack_30dc;
      fStack_3138 = fStack_30b8 + fStack_30d8;
      fStack_3134 = fStack_30b4 + fStack_30d4;
      fStack_3130 = fStack_30b0 + fStack_30d0;
      fStack_312c = fStack_30ac + fStack_30cc;
      fStack_3128 = fStack_30a8 + fStack_30c8;
      fStack_3124 = fStack_30a4 + fStack_30c4;
      uStack_3238 = 0x3d9021bb3d9021bb;
      local_3240 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_3230 = 0x3d9021bb3d9021bb;
      uStack_3228 = 0x3d9021bb3d9021bb;
      auVar36._8_4_ = -0.1151461;
      auVar36._12_4_ = -0.1151461;
      auVar36._0_4_ = -0.1151461;
      auVar36._4_4_ = -0.1151461;
      auVar36._16_4_ = -0.1151461;
      auVar36._20_4_ = -0.1151461;
      auVar36._24_4_ = -0.1151461;
      auVar36._28_4_ = -0.1151461;
      auVar2 = vfmadd213ps_fma(_local_3140,_local_3240,auVar36);
      auVar37._8_4_ = 0.116769984;
      auVar37._12_4_ = 0.116769984;
      auVar37._0_4_ = 0.116769984;
      auVar37._4_4_ = 0.116769984;
      auVar37._16_4_ = 0.116769984;
      auVar37._20_4_ = 0.116769984;
      auVar37._24_4_ = 0.116769984;
      auVar37._28_4_ = 0.116769984;
      auVar2 = vfmadd213ps_fma(_local_3140,ZEXT1632(auVar2),auVar37);
      auVar38._8_4_ = -0.12420141;
      auVar38._12_4_ = -0.12420141;
      auVar38._0_4_ = -0.12420141;
      auVar38._4_4_ = -0.12420141;
      auVar38._16_4_ = -0.12420141;
      auVar38._20_4_ = -0.12420141;
      auVar38._24_4_ = -0.12420141;
      auVar38._28_4_ = -0.12420141;
      auVar2 = vfmadd213ps_fma(_local_3140,ZEXT1632(auVar2),auVar38);
      auVar39._8_4_ = 0.14249323;
      auVar39._12_4_ = 0.14249323;
      auVar39._0_4_ = 0.14249323;
      auVar39._4_4_ = 0.14249323;
      auVar39._16_4_ = 0.14249323;
      auVar39._20_4_ = 0.14249323;
      auVar39._24_4_ = 0.14249323;
      auVar39._28_4_ = 0.14249323;
      auVar2 = vfmadd213ps_fma(_local_3140,ZEXT1632(auVar2),auVar39);
      auVar40._8_4_ = -0.16668057;
      auVar40._12_4_ = -0.16668057;
      auVar40._0_4_ = -0.16668057;
      auVar40._4_4_ = -0.16668057;
      auVar40._16_4_ = -0.16668057;
      auVar40._20_4_ = -0.16668057;
      auVar40._24_4_ = -0.16668057;
      auVar40._28_4_ = -0.16668057;
      auVar2 = vfmadd213ps_fma(_local_3140,ZEXT1632(auVar2),auVar40);
      auVar41._8_4_ = 0.20000714;
      auVar41._12_4_ = 0.20000714;
      auVar41._0_4_ = 0.20000714;
      auVar41._4_4_ = 0.20000714;
      auVar41._16_4_ = 0.20000714;
      auVar41._20_4_ = 0.20000714;
      auVar41._24_4_ = 0.20000714;
      auVar41._28_4_ = 0.20000714;
      auVar2 = vfmadd213ps_fma(_local_3140,ZEXT1632(auVar2),auVar41);
      auVar42._8_4_ = -0.24999994;
      auVar42._12_4_ = -0.24999994;
      auVar42._0_4_ = -0.24999994;
      auVar42._4_4_ = -0.24999994;
      auVar42._16_4_ = -0.24999994;
      auVar42._20_4_ = -0.24999994;
      auVar42._24_4_ = -0.24999994;
      auVar42._28_4_ = -0.24999994;
      auVar2 = vfmadd213ps_fma(_local_3140,ZEXT1632(auVar2),auVar42);
      auVar43._8_4_ = 0.3333333;
      auVar43._12_4_ = 0.3333333;
      auVar43._0_4_ = 0.3333333;
      auVar43._4_4_ = 0.3333333;
      auVar43._16_4_ = 0.3333333;
      auVar43._20_4_ = 0.3333333;
      auVar43._24_4_ = 0.3333333;
      auVar43._28_4_ = 0.3333333;
      auVar2 = vfmadd213ps_fma(_local_3140,ZEXT1632(auVar2),auVar43);
      local_2f80 = auVar2._0_4_;
      fStack_2f7c = auVar2._4_4_;
      fStack_2f78 = auVar2._8_4_;
      fStack_2f74 = auVar2._12_4_;
      local_3240._4_4_ =
           fStack_2f7c * (float)local_3140._4_4_ * (float)local_3140._4_4_ * (float)local_3140._4_4_
      ;
      local_3240._0_4_ =
           local_2f80 * (float)local_3140._0_4_ * (float)local_3140._0_4_ * (float)local_3140._0_4_;
      uStack_3238._0_4_ = fStack_2f78 * fStack_3138 * fStack_3138 * fStack_3138;
      uStack_3238._4_4_ = fStack_2f74 * fStack_3134 * fStack_3134 * fStack_3134;
      uStack_3230._0_4_ = fStack_3130 * 0.0 * fStack_3130 * fStack_3130;
      uStack_3230._4_4_ = fStack_312c * 0.0 * fStack_312c * fStack_312c;
      uStack_3228._0_4_ = fStack_3128 * 0.0 * fStack_3128 * fStack_3128;
      uStack_3228._4_4_ = 0;
      auVar44._8_4_ = -0.00021219444;
      auVar44._12_4_ = -0.00021219444;
      auVar44._0_4_ = -0.00021219444;
      auVar44._4_4_ = -0.00021219444;
      auVar44._16_4_ = -0.00021219444;
      auVar44._20_4_ = -0.00021219444;
      auVar44._24_4_ = -0.00021219444;
      auVar44._28_4_ = -0.00021219444;
      auVar2 = vfmadd213ps_fma(auVar44,auVar113,_local_3240);
      auVar108._4_4_ = (float)local_3140._4_4_ * (float)local_3140._4_4_;
      auVar108._0_4_ = (float)local_3140._0_4_ * (float)local_3140._0_4_;
      auVar108._8_4_ = fStack_3138 * fStack_3138;
      auVar108._12_4_ = fStack_3134 * fStack_3134;
      auVar108._16_4_ = fStack_3130 * fStack_3130;
      auVar108._20_4_ = fStack_312c * fStack_312c;
      auVar108._24_4_ = fStack_3128 * fStack_3128;
      auVar108._28_4_ = fStack_3124;
      auVar60._8_4_ = 0.5;
      auVar60._12_4_ = 0.5;
      auVar60._0_4_ = 0.5;
      auVar60._4_4_ = 0.5;
      auVar60._16_4_ = 0.5;
      auVar60._20_4_ = 0.5;
      auVar60._24_4_ = 0.5;
      auVar60._28_4_ = 0.5;
      auVar2 = vfnmadd213ps_fma(auVar60,auVar108,ZEXT1632(auVar2));
      local_3120 = auVar2._0_4_;
      fStack_311c = auVar2._4_4_;
      fStack_3118 = auVar2._8_4_;
      fStack_3114 = auVar2._12_4_;
      local_3140._4_4_ = (float)local_3140._4_4_ + fStack_311c;
      local_3140._0_4_ = (float)local_3140._0_4_ + local_3120;
      fStack_3138 = fStack_3138 + fStack_3118;
      fStack_3134 = fStack_3134 + fStack_3114;
      fStack_3130 = fStack_3130 + 0.0;
      fStack_312c = fStack_312c + 0.0;
      fStack_3128 = fStack_3128 + 0.0;
      fStack_3124 = fStack_3124 + 0.0;
      auVar45._8_4_ = 0.6933594;
      auVar45._12_4_ = 0.6933594;
      auVar45._0_4_ = 0.6933594;
      auVar45._4_4_ = 0.6933594;
      auVar45._16_4_ = 0.6933594;
      auVar45._20_4_ = 0.6933594;
      auVar45._24_4_ = 0.6933594;
      auVar45._28_4_ = 0.6933594;
      auVar2 = vfmadd213ps_fma(auVar45,auVar113,_local_3140);
      auVar4 = vorps_avx(ZEXT1632(auVar2),auVar1);
      local_3780 = auVar4._0_4_;
      fStack_377c = auVar4._4_4_;
      fStack_3778 = auVar4._8_4_;
      fStack_3774 = auVar4._12_4_;
      fStack_3770 = auVar4._16_4_;
      fStack_376c = auVar4._20_4_;
      fStack_3768 = auVar4._24_4_;
      local_3660._4_4_ = fVar112 * fStack_377c;
      local_3660._0_4_ = fVar112 * local_3780;
      fStack_3658 = fVar112 * fStack_3778;
      fStack_3654 = fVar112 * fStack_3774;
      uStack_3650._0_4_ = uStack_3648._4_4_ * fStack_3770;
      uStack_3650._4_4_ = uStack_3648._4_4_ * fStack_376c;
      uStack_3648._0_4_ = uStack_3648._4_4_ * fStack_3768;
      auVar4 = _local_3660;
      uStack_3648 = auVar4._24_8_;
      auVar10._16_8_ = uStack_3650;
      auVar10._0_16_ = _local_3660;
      auVar10._24_8_ = uStack_3648;
      auVar9._8_8_ = 0x42b0c0a542b0c0a5;
      auVar9._0_8_ = 0x42b0c0a542b0c0a5;
      auVar9._16_8_ = 0x42b0c0a542b0c0a5;
      auVar9._24_8_ = 0x42b0c0a542b0c0a5;
      auVar4 = vminps_avx(auVar10,auVar9);
      auVar8._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar8._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar8._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar8._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar113 = vmaxps_avx(auVar4,auVar8);
      auVar23._8_4_ = 1.442695;
      auVar23._12_4_ = 1.442695;
      auVar23._0_4_ = 1.442695;
      auVar23._4_4_ = 1.442695;
      auVar23._16_4_ = 1.442695;
      auVar23._20_4_ = 1.442695;
      auVar23._24_4_ = 1.442695;
      auVar23._28_4_ = 1.442695;
      auVar22._8_4_ = 0.5;
      auVar22._12_4_ = 0.5;
      auVar22._0_4_ = 0.5;
      auVar22._4_4_ = 0.5;
      auVar22._16_4_ = 0.5;
      auVar22._20_4_ = 0.5;
      auVar22._24_4_ = 0.5;
      auVar22._28_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(auVar23,auVar113,auVar22);
      auVar1 = vroundps_avx(ZEXT1632(auVar2),1);
      auVar4 = vcmpps_avx(ZEXT1632(auVar2),auVar1,1);
      auVar21._8_8_ = 0x3f8000003f800000;
      auVar21._0_8_ = 0x3f8000003f800000;
      auVar21._16_8_ = 0x3f8000003f800000;
      auVar21._24_8_ = 0x3f8000003f800000;
      auVar4 = vandps_avx(auVar4,auVar21);
      auVar4 = vsubps_avx(auVar1,auVar4);
      auVar56._8_4_ = 0.6933594;
      auVar56._12_4_ = 0.6933594;
      auVar56._0_4_ = 0.6933594;
      auVar56._4_4_ = 0.6933594;
      auVar56._16_4_ = 0.6933594;
      auVar56._20_4_ = 0.6933594;
      auVar56._24_4_ = 0.6933594;
      auVar56._28_4_ = 0.6933594;
      auVar2 = vfnmadd213ps_fma(auVar56,auVar4,auVar113);
      auVar57._8_4_ = -0.00021219444;
      auVar57._12_4_ = -0.00021219444;
      auVar57._0_4_ = -0.00021219444;
      auVar57._4_4_ = -0.00021219444;
      auVar57._16_4_ = -0.00021219444;
      auVar57._20_4_ = -0.00021219444;
      auVar57._24_4_ = -0.00021219444;
      auVar57._28_4_ = -0.00021219444;
      auVar2 = vfnmadd213ps_fma(auVar57,auVar4,ZEXT1632(auVar2));
      auVar113 = ZEXT1632(auVar2);
      local_3560 = auVar2._0_4_;
      fStack_355c = auVar2._4_4_;
      fStack_3558 = auVar2._8_4_;
      fStack_3554 = auVar2._12_4_;
      _local_3680 = ZEXT1632(CONCAT412(fStack_3554 * fStack_3554,
                                       CONCAT48(fStack_3558 * fStack_3558,
                                                CONCAT44(fStack_355c * fStack_355c,
                                                         local_3560 * local_3560))));
      uStack_3718 = 0x3950696739506967;
      local_3720 = (undefined1  [8])0x3950696739506967;
      uStack_3710 = 0x3950696739506967;
      uStack_3708 = 0x3950696739506967;
      auVar24._8_4_ = 0.0013981999;
      auVar24._12_4_ = 0.0013981999;
      auVar24._0_4_ = 0.0013981999;
      auVar24._4_4_ = 0.0013981999;
      auVar24._16_4_ = 0.0013981999;
      auVar24._20_4_ = 0.0013981999;
      auVar24._24_4_ = 0.0013981999;
      auVar24._28_4_ = 0.0013981999;
      auVar2 = vfmadd213ps_fma(auVar113,_local_3720,auVar24);
      auVar25._8_4_ = 0.008333452;
      auVar25._12_4_ = 0.008333452;
      auVar25._0_4_ = 0.008333452;
      auVar25._4_4_ = 0.008333452;
      auVar25._16_4_ = 0.008333452;
      auVar25._20_4_ = 0.008333452;
      auVar25._24_4_ = 0.008333452;
      auVar25._28_4_ = 0.008333452;
      auVar2 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar2),auVar25);
      auVar26._8_4_ = 0.041665796;
      auVar26._12_4_ = 0.041665796;
      auVar26._0_4_ = 0.041665796;
      auVar26._4_4_ = 0.041665796;
      auVar26._16_4_ = 0.041665796;
      auVar26._20_4_ = 0.041665796;
      auVar26._24_4_ = 0.041665796;
      auVar26._28_4_ = 0.041665796;
      auVar2 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar2),auVar26);
      auVar27._8_4_ = 0.16666666;
      auVar27._12_4_ = 0.16666666;
      auVar27._0_4_ = 0.16666666;
      auVar27._4_4_ = 0.16666666;
      auVar27._16_4_ = 0.16666666;
      auVar27._20_4_ = 0.16666666;
      auVar27._24_4_ = 0.16666666;
      auVar27._28_4_ = 0.16666666;
      auVar2 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar2),auVar27);
      auVar28._8_4_ = 0.5;
      auVar28._12_4_ = 0.5;
      auVar28._0_4_ = 0.5;
      auVar28._4_4_ = 0.5;
      auVar28._16_4_ = 0.5;
      auVar28._20_4_ = 0.5;
      auVar28._24_4_ = 0.5;
      auVar28._28_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar2),auVar28);
      auVar2 = vfmadd213ps_fma(_local_3680,ZEXT1632(auVar2),auVar113);
      local_3620 = auVar2._0_4_;
      fStack_361c = auVar2._4_4_;
      fStack_3618 = auVar2._8_4_;
      fStack_3614 = auVar2._12_4_;
      local_2500 = auVar4._0_4_;
      fStack_24fc = auVar4._4_4_;
      fStack_24f8 = auVar4._8_4_;
      fStack_24f4 = auVar4._12_4_;
      fStack_24f0 = auVar4._16_4_;
      fStack_24ec = auVar4._20_4_;
      fStack_24e8 = auVar4._24_4_;
      fStack_24e4 = auVar4._28_4_;
      local_36c0 = CONCAT44((int)fStack_24fc,(int)local_2500);
      uStack_36b8 = CONCAT44((int)fStack_24f4,(int)fStack_24f8);
      uStack_36b0 = CONCAT44((int)fStack_24ec,(int)fStack_24f0);
      uStack_36a8 = CONCAT44((int)fStack_24e4,(int)fStack_24e8);
      auVar65._8_8_ = uStack_36b8;
      auVar65._0_8_ = local_36c0;
      auVar64._8_8_ = 0x7f0000007f;
      auVar64._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar65,auVar64);
      auVar63._8_8_ = uStack_36a8;
      auVar63._0_8_ = uStack_36b0;
      auVar62._8_8_ = 0x7f0000007f;
      auVar62._0_8_ = 0x7f0000007f;
      auVar3 = vpaddd_avx(auVar63,auVar62);
      auVar2 = vpslld_avx(auVar2,ZEXT416(0x17));
      auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
      local_35c0 = auVar2._0_4_;
      fStack_35bc = auVar2._4_4_;
      fStack_35b8 = auVar2._8_4_;
      fStack_35b4 = auVar2._12_4_;
      fStack_35b0 = auVar3._0_4_;
      fStack_35ac = auVar3._4_4_;
      fStack_35a8 = auVar3._8_4_;
      local_3720._4_4_ = (fStack_361c + 1.0) * fStack_35bc;
      local_3720._0_4_ = (local_3620 + 1.0) * local_35c0;
      uStack_3718._0_4_ = (fStack_3618 + 1.0) * fStack_35b8;
      uStack_3718._4_4_ = (fStack_3614 + 1.0) * fStack_35b4;
      uStack_3710._0_4_ = fStack_35b0 * 1.0;
      uStack_3710._4_4_ = fStack_35ac * 1.0;
      auVar111 = _local_3720;
      uStack_3708._0_4_ = fStack_35a8 * 1.0;
      uStack_3708._4_4_ = 0x3f800000;
      auVar4 = _local_3720;
      uStack_3710 = auVar111._16_8_;
      uStack_3708 = auVar4._24_8_;
      *local_3a28 = local_3720;
      local_3a28[1] = uStack_3718;
      local_3a28[2] = uStack_3710;
      local_3a28[3] = uStack_3708;
      local_3a18 = local_3a18 + 1;
      local_3a20 = local_3a20 + 2;
      local_3a28 = local_3a28 + 4;
    }
    for (; local_3aa4 < in_ECX; local_3aa4 = local_3aa4 + 1) {
      fVar112 = *local_3a20;
      auVar2 = vcmpps_avx(*(undefined1 (*) [16])*local_3a18,ZEXT816(0),2);
      auVar81._8_8_ = 0x80000000800000;
      auVar81._0_8_ = 0x80000000800000;
      auVar3 = vmaxps_avx(*(undefined1 (*) [16])*local_3a18,auVar81);
      auVar6 = vpsrld_avx(auVar3,ZEXT416(0x17));
      auVar86._8_8_ = 0x807fffff807fffff;
      auVar86._0_8_ = 0x807fffff807fffff;
      auVar3 = vpand_avx(auVar3,auVar86);
      auVar106._8_8_ = 0x3f0000003f000000;
      auVar106._0_8_ = 0x3f0000003f000000;
      auVar7 = vpor_avx(auVar3,auVar106);
      auVar82._8_8_ = 0x7f0000007f;
      auVar82._0_8_ = 0x7f0000007f;
      auVar3 = vpsubd_avx(auVar6,auVar82);
      auVar3 = vcvtdq2ps_avx(auVar3);
      local_840 = auVar3._0_4_;
      fStack_83c = auVar3._4_4_;
      fStack_838 = auVar3._8_4_;
      fStack_834 = auVar3._12_4_;
      local_8e0 = CONCAT44(fStack_83c + 1.0,local_840 + 1.0);
      uStack_8d8._0_4_ = fStack_838 + 1.0;
      uStack_8d8._4_4_ = fStack_834 + 1.0;
      auVar107._8_8_ = 0x3f3504f33f3504f3;
      auVar107._0_8_ = 0x3f3504f33f3504f3;
      auVar3 = vcmpps_avx(auVar7,auVar107,1);
      auVar6 = vpand_avx(auVar7,auVar3);
      auVar80._8_8_ = 0x3f8000003f800000;
      auVar80._0_8_ = 0x3f8000003f800000;
      auVar7 = vsubps_avx(auVar7,auVar80);
      auVar85._8_8_ = 0x3f8000003f800000;
      auVar85._0_8_ = 0x3f8000003f800000;
      auVar3 = vpand_avx(auVar85,auVar3);
      auVar79._8_8_ = uStack_8d8;
      auVar79._0_8_ = local_8e0;
      auVar3 = vsubps_avx(auVar79,auVar3);
      local_860 = auVar7._0_4_;
      fStack_85c = auVar7._4_4_;
      fStack_858 = auVar7._8_4_;
      fStack_854 = auVar7._12_4_;
      local_870 = auVar6._0_4_;
      fStack_86c = auVar6._4_4_;
      fStack_868 = auVar6._8_4_;
      fStack_864 = auVar6._12_4_;
      local_8a0._0_4_ = local_860 + local_870;
      local_8a0._4_4_ = fStack_85c + fStack_86c;
      fStack_898 = fStack_858 + fStack_868;
      fStack_894 = fStack_854 + fStack_864;
      uStack_918 = 0x3d9021bb3d9021bb;
      local_920 = (undefined1  [8])0x3d9021bb3d9021bb;
      auVar96._8_4_ = -0.1151461;
      auVar96._12_4_ = -0.1151461;
      auVar96._0_4_ = -0.1151461;
      auVar96._4_4_ = -0.1151461;
      auVar6 = vfmadd213ps_fma(_local_8a0,_local_920,auVar96);
      auVar97._8_4_ = 0.116769984;
      auVar97._12_4_ = 0.116769984;
      auVar97._0_4_ = 0.116769984;
      auVar97._4_4_ = 0.116769984;
      auVar6 = vfmadd213ps_fma(_local_8a0,auVar6,auVar97);
      auVar98._8_4_ = -0.12420141;
      auVar98._12_4_ = -0.12420141;
      auVar98._0_4_ = -0.12420141;
      auVar98._4_4_ = -0.12420141;
      auVar6 = vfmadd213ps_fma(_local_8a0,auVar6,auVar98);
      auVar99._8_4_ = 0.14249323;
      auVar99._12_4_ = 0.14249323;
      auVar99._0_4_ = 0.14249323;
      auVar99._4_4_ = 0.14249323;
      auVar6 = vfmadd213ps_fma(_local_8a0,auVar6,auVar99);
      auVar100._8_4_ = -0.16668057;
      auVar100._12_4_ = -0.16668057;
      auVar100._0_4_ = -0.16668057;
      auVar100._4_4_ = -0.16668057;
      auVar6 = vfmadd213ps_fma(_local_8a0,auVar6,auVar100);
      auVar101._8_4_ = 0.20000714;
      auVar101._12_4_ = 0.20000714;
      auVar101._0_4_ = 0.20000714;
      auVar101._4_4_ = 0.20000714;
      auVar6 = vfmadd213ps_fma(_local_8a0,auVar6,auVar101);
      auVar102._8_4_ = -0.24999994;
      auVar102._12_4_ = -0.24999994;
      auVar102._0_4_ = -0.24999994;
      auVar102._4_4_ = -0.24999994;
      auVar6 = vfmadd213ps_fma(_local_8a0,auVar6,auVar102);
      auVar103._8_4_ = 0.3333333;
      auVar103._12_4_ = 0.3333333;
      auVar103._0_4_ = 0.3333333;
      auVar103._4_4_ = 0.3333333;
      auVar6 = vfmadd213ps_fma(_local_8a0,auVar6,auVar103);
      local_7c0 = auVar6._0_4_;
      fStack_7bc = auVar6._4_4_;
      fStack_7b8 = auVar6._8_4_;
      fStack_7b4 = auVar6._12_4_;
      local_920._4_4_ =
           fStack_7bc * (float)local_8a0._4_4_ * (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
      local_920._0_4_ =
           local_7c0 * (float)local_8a0._0_4_ * (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
      uStack_918._0_4_ = fStack_7b8 * fStack_898 * fStack_898 * fStack_898;
      uStack_918._4_4_ = fStack_7b4 * fStack_894 * fStack_894 * fStack_894;
      auVar104._8_4_ = -0.00021219444;
      auVar104._12_4_ = -0.00021219444;
      auVar104._0_4_ = -0.00021219444;
      auVar104._4_4_ = -0.00021219444;
      auVar6 = vfmadd213ps_fma(auVar104,auVar3,_local_920);
      auVar110._4_4_ = (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
      auVar110._0_4_ = (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
      auVar110._8_4_ = fStack_898 * fStack_898;
      auVar110._12_4_ = fStack_894 * fStack_894;
      auVar90._8_4_ = 0.5;
      auVar90._12_4_ = 0.5;
      auVar90._0_4_ = 0.5;
      auVar90._4_4_ = 0.5;
      auVar6 = vfnmadd213ps_fma(auVar90,auVar110,auVar6);
      local_890 = auVar6._0_4_;
      fStack_88c = auVar6._4_4_;
      fStack_888 = auVar6._8_4_;
      fStack_884 = auVar6._12_4_;
      local_8a0._4_4_ = (float)local_8a0._4_4_ + fStack_88c;
      local_8a0._0_4_ = (float)local_8a0._0_4_ + local_890;
      fStack_898 = fStack_898 + fStack_888;
      fStack_894 = fStack_894 + fStack_884;
      auVar105._8_4_ = 0.6933594;
      auVar105._12_4_ = 0.6933594;
      auVar105._0_4_ = 0.6933594;
      auVar105._4_4_ = 0.6933594;
      auVar3 = vfmadd213ps_fma(auVar105,auVar3,_local_8a0);
      auVar2 = vpor_avx(auVar3,auVar2);
      local_b00 = auVar2._0_4_;
      fStack_afc = auVar2._4_4_;
      fStack_af8 = auVar2._8_4_;
      fStack_af4 = auVar2._12_4_;
      local_a70 = CONCAT44(fVar112 * fStack_afc,fVar112 * local_b00);
      uStack_a68._0_4_ = fVar112 * fStack_af8;
      uStack_a68._4_4_ = fVar112 * fStack_af4;
      auVar76._8_8_ = uStack_a68;
      auVar76._0_8_ = local_a70;
      auVar75._8_8_ = 0x42b0c0a542b0c0a5;
      auVar75._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar76,auVar75);
      auVar74._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar74._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar2,auVar74);
      local_9b0 = auVar6._0_4_;
      fStack_9ac = auVar6._4_4_;
      fStack_9a8 = auVar6._8_4_;
      fStack_9a4 = auVar6._12_4_;
      fVar112 = local_9b0 * 1.442695 + 0.5;
      fVar114 = fStack_9ac * 1.442695 + 0.5;
      fVar115 = fStack_9a8 * 1.442695 + 0.5;
      fVar116 = fStack_9a4 * 1.442695 + 0.5;
      local_a90 = CONCAT44(fVar114,fVar112);
      uStack_a88._0_4_ = fVar115;
      uStack_a88._4_4_ = fVar116;
      local_aa0 = CONCAT44((int)fVar114,(int)fVar112);
      uStack_a98._0_4_ = (int)fVar115;
      uStack_a98._4_4_ = (int)fVar116;
      auVar83._8_8_ = uStack_a98;
      auVar83._0_8_ = local_aa0;
      auVar3 = vcvtdq2ps_avx(auVar83);
      auVar84._8_8_ = uStack_a88;
      auVar84._0_8_ = local_a90;
      auVar2 = vcmpps_avx(auVar84,auVar3,1);
      auVar87._8_8_ = 0x3f8000003f800000;
      auVar87._0_8_ = 0x3f8000003f800000;
      auVar2 = vpand_avx(auVar2,auVar87);
      auVar2 = vsubps_avx(auVar3,auVar2);
      auVar88._8_4_ = 0.6933594;
      auVar88._12_4_ = 0.6933594;
      auVar88._0_4_ = 0.6933594;
      auVar88._4_4_ = 0.6933594;
      auVar3 = vfnmadd213ps_fma(auVar88,auVar2,auVar6);
      auVar89._8_4_ = -0.00021219444;
      auVar89._12_4_ = -0.00021219444;
      auVar89._0_4_ = -0.00021219444;
      auVar89._4_4_ = -0.00021219444;
      auVar6 = vfnmadd213ps_fma(auVar89,auVar2,auVar3);
      local_9d0 = auVar6._0_4_;
      fStack_9cc = auVar6._4_4_;
      fStack_9c8 = auVar6._8_4_;
      fStack_9c4 = auVar6._12_4_;
      local_a80._4_4_ = fStack_9cc * fStack_9cc;
      local_a80._0_4_ = local_9d0 * local_9d0;
      fStack_a78 = fStack_9c8 * fStack_9c8;
      fStack_a74 = fStack_9c4 * fStack_9c4;
      uStack_ac8 = 0x3950696739506967;
      local_ad0 = (undefined1  [8])0x3950696739506967;
      auVar91._8_4_ = 0.0013981999;
      auVar91._12_4_ = 0.0013981999;
      auVar91._0_4_ = 0.0013981999;
      auVar91._4_4_ = 0.0013981999;
      auVar3 = vfmadd213ps_fma(auVar6,_local_ad0,auVar91);
      auVar92._8_4_ = 0.008333452;
      auVar92._12_4_ = 0.008333452;
      auVar92._0_4_ = 0.008333452;
      auVar92._4_4_ = 0.008333452;
      auVar3 = vfmadd213ps_fma(auVar6,auVar3,auVar92);
      auVar93._8_4_ = 0.041665796;
      auVar93._12_4_ = 0.041665796;
      auVar93._0_4_ = 0.041665796;
      auVar93._4_4_ = 0.041665796;
      auVar3 = vfmadd213ps_fma(auVar6,auVar3,auVar93);
      auVar94._8_4_ = 0.16666666;
      auVar94._12_4_ = 0.16666666;
      auVar94._0_4_ = 0.16666666;
      auVar94._4_4_ = 0.16666666;
      auVar3 = vfmadd213ps_fma(auVar6,auVar3,auVar94);
      auVar95._8_4_ = 0.5;
      auVar95._12_4_ = 0.5;
      auVar95._0_4_ = 0.5;
      auVar95._4_4_ = 0.5;
      auVar3 = vfmadd213ps_fma(auVar6,auVar3,auVar95);
      auVar3 = vfmadd213ps_fma(_local_a80,auVar3,auVar6);
      local_a50 = auVar3._0_4_;
      fStack_a4c = auVar3._4_4_;
      fStack_a48 = auVar3._8_4_;
      fStack_a44 = auVar3._12_4_;
      local_710 = auVar2._0_4_;
      fStack_70c = auVar2._4_4_;
      fStack_708 = auVar2._8_4_;
      fStack_704 = auVar2._12_4_;
      local_aa0 = CONCAT44((int)fStack_70c,(int)local_710);
      uStack_a98._0_4_ = (int)fStack_708;
      uStack_a98._4_4_ = (int)fStack_704;
      auVar78._8_8_ = uStack_a98;
      auVar78._0_8_ = local_aa0;
      auVar77._8_8_ = 0x7f0000007f;
      auVar77._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar78,auVar77);
      auVar2 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_a00 = auVar2._0_4_;
      fStack_9fc = auVar2._4_4_;
      fStack_9f8 = auVar2._8_4_;
      fStack_9f4 = auVar2._12_4_;
      local_ad0._4_4_ = (fStack_a4c + 1.0) * fStack_9fc;
      local_ad0._0_4_ = (local_a50 + 1.0) * local_a00;
      uStack_ac8._0_4_ = (fStack_a48 + 1.0) * fStack_9f8;
      uStack_ac8._4_4_ = (fStack_a44 + 1.0) * fStack_9f4;
      *local_3a28 = local_ad0;
      local_3a28[1] = uStack_ac8;
      local_3a18 = (undefined1 (*) [32])(*local_3a18 + 0x10);
      local_3a20 = local_3a20 + 1;
      local_3a28 = local_3a28 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}